

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TextureSwizzle::SmokeTest::prepareAndTestProgram
          (SmokeTest *this,testCase *test_case,size_t output_format_index,GLint output_channel_size,
          size_t index_of_swizzled_channel,bool test_vertex_stage)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  GLchar *fragment_shader_code;
  GLchar *vertex_shader_code;
  TestError *this_00;
  long lVar4;
  undefined1 local_e8 [4];
  GLint location;
  programInfo program;
  string local_c0;
  string *local_a0;
  string *vs;
  string *local_78;
  string *fs;
  Functions *gl;
  GLint param [4];
  GLint alpha;
  GLint blue;
  GLint green;
  GLint red;
  _texture_target *source_target;
  bool test_vertex_stage_local;
  size_t index_of_swizzled_channel_local;
  GLint output_channel_size_local;
  size_t output_format_index_local;
  testCase *test_case_local;
  SmokeTest *this_local;
  
  lVar4 = test_case->m_source_texture_target_index * 0x30;
  gl._0_4_ = test_case->m_texture_swizzle_red;
  gl._4_4_ = test_case->m_texture_swizzle_green;
  param[0] = test_case->m_texture_swizzle_blue;
  param[1] = test_case->m_texture_swizzle_alpha;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  fs = (string *)CONCAT44(extraout_var,iVar1);
  getFragmentShader_abi_cxx11_
            ((string *)&vs,this,test_case,output_format_index,(bool)(~test_vertex_stage & 1));
  local_78 = (string *)&vs;
  getVertexShader_abi_cxx11_(&local_c0,this,test_case,test_vertex_stage);
  local_a0 = &local_c0;
  Utils::programInfo::programInfo((programInfo *)local_e8,(this->super_TestCase).m_context);
  fragment_shader_code = (GLchar *)std::__cxx11::string::c_str();
  vertex_shader_code = (GLchar *)std::__cxx11::string::c_str();
  Utils::programInfo::build((programInfo *)local_e8,fragment_shader_code,vertex_shader_code);
  (**(code **)(fs + 0xb4))(program.m_context._4_4_);
  dVar2 = (**(code **)(fs + 0x40))();
  glu::checkError(dVar2,"UseProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xc23);
  iVar1 = (*(code *)fs[0x5a]._M_string_length)(program.m_context._4_4_,"sampler");
  dVar2 = (**(code **)(fs + 0x40))();
  glu::checkError(dVar2,"GetUniformLocation",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xc27);
  if (iVar1 == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Uniform is not available",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
               ,0xc2b);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*(code *)fs[0xa7].field_2._M_allocated_capacity)(iVar1,0);
  dVar2 = (**(code **)(fs + 0x40))();
  glu::checkError(dVar2,"Uniform1i",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xc2f);
  draw(this,*(GLenum *)(texture_targets + lVar4 + 0x28),(GLint *)&gl,false);
  captureAndVerify(this,test_case,output_format_index,output_channel_size,index_of_swizzled_channel)
  ;
  draw(this,*(GLenum *)(texture_targets + lVar4 + 0x28),(GLint *)&gl,true);
  captureAndVerify(this,test_case,output_format_index,output_channel_size,index_of_swizzled_channel)
  ;
  Utils::programInfo::~programInfo((programInfo *)local_e8);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&vs);
  return;
}

Assistant:

void SmokeTest::prepareAndTestProgram(const testCase& test_case, size_t output_format_index,
									  glw::GLint output_channel_size, size_t index_of_swizzled_channel,
									  bool test_vertex_stage)
{
	const _texture_target& source_target = texture_targets[test_case.m_source_texture_target_index];
	const glw::GLint	   red			 = test_case.m_texture_swizzle_red;
	const glw::GLint	   green		 = test_case.m_texture_swizzle_green;
	const glw::GLint	   blue			 = test_case.m_texture_swizzle_blue;
	const glw::GLint	   alpha		 = test_case.m_texture_swizzle_alpha;
	const glw::GLint	   param[4]		 = { red, green, blue, alpha };

	/*  */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Prepare program */
	const std::string& fs = getFragmentShader(test_case, output_format_index, !test_vertex_stage);
	const std::string& vs = getVertexShader(test_case, test_vertex_stage);

	Utils::programInfo program(m_context);
	program.build(fs.c_str(), vs.c_str());

	gl.useProgram(program.m_program_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgram");

	/* Prepare sampler */
	glw::GLint location = gl.getUniformLocation(program.m_program_object_id, "sampler");
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformLocation");

	if (-1 == location)
	{
		TCU_FAIL("Uniform is not available");
	}

	gl.uniform1i(location, 0 /* texture unit */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");

	draw(source_target.m_target, param, false);
	captureAndVerify(test_case, output_format_index, output_channel_size, index_of_swizzled_channel);

	draw(source_target.m_target, param, true);
	captureAndVerify(test_case, output_format_index, output_channel_size, index_of_swizzled_channel);
}